

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall QPDFWriter::setOutputMemory(QPDFWriter *this)

{
  size_t *psVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Pl_Buffer *this_00;
  _List_node_base *p_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->filename =
       "memory buffer";
  this_00 = (Pl_Buffer *)operator_new(0x38);
  Pl_Buffer::Pl_Buffer(this_00,"qpdf output",(Pipeline *)0x0);
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2->buffer_pipeline = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Pl_Buffer*>(&_Stack_20,this_00);
  p_Var4 = (_List_node_base *)operator_new(0x20);
  _Var3._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4[1]._M_next = (_List_node_base *)this_00;
  p_Var4[1]._M_prev = (_List_node_base *)_Var3._M_pi;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = (size_t *)
           ((long)&(peVar2->to_delete).
                   super__List_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>
                   ._M_impl._M_node + 0x10);
  *psVar1 = *psVar1 + 1;
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  initializePipelineStack
            (this,&((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->buffer_pipeline->super_Pipeline);
  return;
}

Assistant:

void
QPDFWriter::setOutputMemory()
{
    m->filename = "memory buffer";
    m->buffer_pipeline = new Pl_Buffer("qpdf output");
    m->to_delete.push_back(std::shared_ptr<Pipeline>(m->buffer_pipeline));
    initializePipelineStack(m->buffer_pipeline);
}